

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

void EVP_MD_free(EVP_MD *md)

{
  long in_RDI;
  int i;
  int local_c [3];
  
  if (((in_RDI != 0) && (*(int *)(in_RDI + 0x18) == 0)) &&
     (CRYPTO_DOWN_REF((int *)(in_RDI + 0x78),local_c,*(void **)(in_RDI + 0x80)), local_c[0] < 1)) {
    evp_md_free_int((EVP_MD *)0x2581d0);
  }
  return;
}

Assistant:

void EVP_MD_free(EVP_MD *md)
{
    int i;

    if (md == NULL || md->origin != EVP_ORIG_DYNAMIC)
        return;

    CRYPTO_DOWN_REF(&md->refcnt, &i, md->lock);
    if (i > 0)
        return;
    evp_md_free_int(md);
}